

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGDump(FILE *output,xmlRelaxNGPtr schema)

{
  xmlRelaxNGCombine xVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (output != (FILE *)0x0) {
    if (schema == (xmlRelaxNGPtr)0x0) {
      pcVar4 = "RelaxNG empty or failed to compile\n";
      sVar3 = 0x23;
    }
    else {
      fwrite("RelaxNG: ",9,1,(FILE *)output);
      if (schema->doc == (xmlDocPtr)0x0) {
        fwrite("no document\n",0xc,1,(FILE *)output);
      }
      else if (schema->doc->URL == (xmlChar *)0x0) {
        fputc(10,(FILE *)output);
      }
      else {
        fprintf((FILE *)output,"%s\n");
      }
      pxVar2 = schema->topgrammar;
      if (pxVar2 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
        pcVar4 = "RelaxNG has no top grammar\n";
        sVar3 = 0x1b;
      }
      else {
        fwrite("<grammar",8,1,(FILE *)output);
        fwrite(" xmlns=\"http://relaxng.org/ns/structure/1.0\"",0x2c,1,(FILE *)output);
        xVar1 = pxVar2->combine;
        if (xVar1 != XML_RELAXNG_COMBINE_UNDEFINED) {
          if (xVar1 == XML_RELAXNG_COMBINE_INTERLEAVE) {
            pcVar4 = " combine=\"interleave\"";
            sVar3 = 0x15;
          }
          else if (xVar1 == XML_RELAXNG_COMBINE_CHOICE) {
            pcVar4 = " combine=\"choice\"";
            sVar3 = 0x11;
          }
          else {
            pcVar4 = " <!-- invalid combine value -->";
            sVar3 = 0x1f;
          }
          fwrite(pcVar4,sVar3,1,(FILE *)output);
        }
        fwrite(">\n",2,1,(FILE *)output);
        if (pxVar2->start == (xmlRelaxNGDefinePtr_conflict)0x0) {
          pcVar4 = " <!-- grammar had no start -->";
          sVar3 = 0x1e;
        }
        else {
          fwrite("<start>\n",8,1,(FILE *)output);
          xmlRelaxNGDumpDefine(output,pxVar2->start);
          pcVar4 = "</start>\n";
          sVar3 = 9;
        }
        fwrite(pcVar4,sVar3,1,(FILE *)output);
        pcVar4 = "</grammar>\n";
        sVar3 = 0xb;
      }
    }
    fwrite(pcVar4,sVar3,1,(FILE *)output);
    return;
  }
  return;
}

Assistant:

void
xmlRelaxNGDump(FILE * output, xmlRelaxNGPtr schema)
{
    if (output == NULL)
        return;
    if (schema == NULL) {
        fprintf(output, "RelaxNG empty or failed to compile\n");
        return;
    }
    fprintf(output, "RelaxNG: ");
    if (schema->doc == NULL) {
        fprintf(output, "no document\n");
    } else if (schema->doc->URL != NULL) {
        fprintf(output, "%s\n", schema->doc->URL);
    } else {
        fprintf(output, "\n");
    }
    if (schema->topgrammar == NULL) {
        fprintf(output, "RelaxNG has no top grammar\n");
        return;
    }
    xmlRelaxNGDumpGrammar(output, schema->topgrammar, 1);
}